

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall
cppnet::Dispatcher::Dispatcher
          (Dispatcher *this,shared_ptr<cppnet::CppNetBase> *base,uint32_t base_id)

{
  element_type *peVar1;
  shared_ptr<cppnet::EventActions> local_50 [2];
  shared_ptr<cppnet::Timer> local_30;
  uint32_t local_1c;
  shared_ptr<cppnet::CppNetBase> *psStack_18;
  uint32_t base_id_local;
  shared_ptr<cppnet::CppNetBase> *base_local;
  Dispatcher *this_local;
  
  local_1c = base_id;
  psStack_18 = base;
  base_local = (shared_ptr<cppnet::CppNetBase> *)this;
  Thread::Thread(&this->super_Thread);
  std::enable_shared_from_this<cppnet::Dispatcher>::enable_shared_from_this
            (&this->super_enable_shared_from_this<cppnet::Dispatcher>);
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Dispatcher_00193f20;
  this->_cur_utc_time = 0;
  std::mutex::mutex(&this->_timer_id_mutex);
  this->_timer_id_creater = 0;
  std::mutex::mutex(&this->_task_list_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&this->_task_list);
  std::thread::id::id(&this->_local_thread_id);
  std::shared_ptr<cppnet::Timer>::shared_ptr(&this->_timer);
  std::shared_ptr<cppnet::EventActions>::shared_ptr(&this->_event_actions);
  std::weak_ptr<cppnet::CppNetBase>::weak_ptr<cppnet::CppNetBase,void>(&this->_cppnet_base,base);
  MakeTimer1Min();
  std::shared_ptr<cppnet::Timer>::operator=(&this->_timer,&local_30);
  std::shared_ptr<cppnet::Timer>::~shared_ptr(&local_30);
  MakeEventActions();
  std::shared_ptr<cppnet::EventActions>::operator=(&this->_event_actions,local_50);
  std::shared_ptr<cppnet::EventActions>::~shared_ptr(local_50);
  peVar1 = std::__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_event_actions);
  (*peVar1->_vptr_EventActions[2])(peVar1,0);
  (*(this->super_Thread)._vptr_Thread[2])();
  return;
}

Assistant:

Dispatcher::Dispatcher(std::shared_ptr<CppNetBase> base, uint32_t base_id):
    _cur_utc_time(0),
    _timer_id_creater(0),
    _cppnet_base(base) {

    _timer = MakeTimer1Min();

    _event_actions = MakeEventActions();
    _event_actions->Init();

    // start thread
    Start();
}